

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<void> *
testing::internal::ActionResultHolder<void>::
PerformAction<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::Error)>
          (Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<void> *pAVar1;
  undefined1 local_40 [48];
  
  std::
  _Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ::_Tuple_impl((_Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                 *)local_40,
                &args->
                 super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
               );
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  ::Perform(action,(ArgumentTuple *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  pAVar1 = (ActionResultHolder<void> *)operator_new(8);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_0029ed98;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    action.Perform(std::move(args));
    return new ActionResultHolder;
  }